

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim)

{
  byte bVar1;
  LexChar LVar2;
  SQUnsignedInteger SVar3;
  SQInteger SVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  SQUnsignedInteger SVar8;
  SQChar temp [9];
  SQChar *stemp;
  undefined1 local_50 [16];
  sqvector<char> *local_40;
  char *local_38;
  
  local_50[0] = '\0';
  sqvector<char>::resize(&this->_longstr,0,local_50);
  SVar4 = (*this->_readf)(this->_up);
  if (0xff < SVar4) {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  if (SVar4 == 0) {
    this->_currdata = '\0';
    this->_reached_eof = 1;
  }
  else {
    this->_currdata = (LexChar)SVar4;
  }
  this->_currentcolumn = this->_currentcolumn + 1;
  local_40 = &this->_longstr;
  if (this->_currdata == '\0') {
    return -1;
  }
LAB_00116c50:
  bVar1 = this->_currdata;
  if ((ulong)bVar1 == ndelim) {
    SVar4 = (*this->_readf)(this->_up);
    if (0xff < SVar4) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar4 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar4;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    if ((!verbatim) || (this->_currdata != '\"')) {
      local_50[0] = '\0';
      sqvector<char>::push_back(local_40,local_50);
      if (ndelim == 0x27) {
        SVar3 = (this->_longstr)._size;
        if (SVar3 == 1) {
          (*this->_errfunc)(this->_errtarget,"empty constant");
        }
        if (1 < (long)(SVar3 - 1)) {
          (*this->_errfunc)(this->_errtarget,"constant too long");
        }
        this->_nvalue = (long)*(this->_longstr)._vals;
        return 0x104;
      }
      this->_svalue = (this->_longstr)._vals;
      return 0x103;
    }
    uVar6 = (this->_longstr)._size;
    SVar3 = (this->_longstr)._allocated;
    if (SVar3 <= uVar6) {
      SVar8 = uVar6 * 2;
      if (SVar8 == 0) {
        SVar8 = 4;
      }
      pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
      (this->_longstr)._vals = pcVar5;
      (this->_longstr)._allocated = SVar8;
    }
    SVar3 = (this->_longstr)._size;
    (this->_longstr)._size = SVar3 + 1;
    (this->_longstr)._vals[SVar3] = '\"';
  }
  else {
    if (bVar1 == 10) {
      if (!verbatim) {
        (*this->_errfunc)(this->_errtarget,"newline in a constant");
      }
      LVar2 = this->_currdata;
      SVar3 = (this->_longstr)._allocated;
      uVar6 = (this->_longstr)._size;
      if (SVar3 <= uVar6) {
        SVar8 = uVar6 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
        (this->_longstr)._vals = pcVar5;
        (this->_longstr)._allocated = SVar8;
      }
      SVar3 = (this->_longstr)._size;
      (this->_longstr)._size = SVar3 + 1;
      (this->_longstr)._vals[SVar3] = LVar2;
      SVar4 = (*this->_readf)(this->_up);
      if (0xff < SVar4) {
        (*this->_errfunc)(this->_errtarget,"Invalid character");
      }
      if (SVar4 == 0) {
        this->_currdata = '\0';
        this->_reached_eof = 1;
      }
      else {
        this->_currdata = (LexChar)SVar4;
      }
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_currentline = this->_currentline + 1;
      goto LAB_00116c50;
    }
    if (bVar1 == 0x5c) {
      if (verbatim) {
        uVar6 = (this->_longstr)._size;
        SVar3 = (this->_longstr)._allocated;
        if (SVar3 <= uVar6) {
          SVar8 = uVar6 * 2;
          if (SVar8 == 0) {
            SVar8 = 4;
          }
          pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
          (this->_longstr)._vals = pcVar5;
          (this->_longstr)._allocated = SVar8;
        }
LAB_00116d01:
        SVar3 = (this->_longstr)._size;
        (this->_longstr)._size = SVar3 + 1;
        (this->_longstr)._vals[SVar3] = '\\';
      }
      else {
        SVar4 = (*this->_readf)(this->_up);
        if (0xff < SVar4) {
          (*this->_errfunc)(this->_errtarget,"Invalid character");
        }
        if (SVar4 == 0) {
          this->_currdata = '\0';
          this->_reached_eof = 1;
        }
        else {
          this->_currdata = (LexChar)SVar4;
        }
        this->_currentcolumn = this->_currentcolumn + 1;
        bVar1 = this->_currdata;
        if (bVar1 < 0x62) {
          if (bVar1 < 0x55) {
            if (bVar1 == 0x22) {
              uVar6 = (this->_longstr)._size;
              SVar3 = (this->_longstr)._allocated;
              if (SVar3 <= uVar6) {
                SVar8 = uVar6 * 2;
                if (SVar8 == 0) {
                  SVar8 = 4;
                }
                pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
                (this->_longstr)._vals = pcVar5;
                (this->_longstr)._allocated = SVar8;
              }
              SVar3 = (this->_longstr)._size;
              (this->_longstr)._size = SVar3 + 1;
              (this->_longstr)._vals[SVar3] = '\"';
            }
            else if (bVar1 == 0x27) {
              uVar6 = (this->_longstr)._size;
              SVar3 = (this->_longstr)._allocated;
              if (SVar3 <= uVar6) {
                SVar8 = uVar6 * 2;
                if (SVar8 == 0) {
                  SVar8 = 4;
                }
                pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
                (this->_longstr)._vals = pcVar5;
                (this->_longstr)._allocated = SVar8;
              }
              SVar3 = (this->_longstr)._size;
              (this->_longstr)._size = SVar3 + 1;
              (this->_longstr)._vals[SVar3] = '\'';
            }
            else {
              if (bVar1 != 0x30) goto switchD_00116eca_caseD_6f;
              uVar6 = (this->_longstr)._size;
              SVar3 = (this->_longstr)._allocated;
              if (SVar3 <= uVar6) {
                SVar8 = uVar6 * 2;
                if (SVar8 == 0) {
                  SVar8 = 4;
                }
                pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
                (this->_longstr)._vals = pcVar5;
                (this->_longstr)._allocated = SVar8;
              }
              SVar3 = (this->_longstr)._size;
              (this->_longstr)._size = SVar3 + 1;
              (this->_longstr)._vals[SVar3] = '\0';
            }
          }
          else {
            if (bVar1 == 0x55) goto switchD_00116eca_caseD_75;
            if (bVar1 == 0x5c) {
              uVar6 = (this->_longstr)._size;
              SVar3 = (this->_longstr)._allocated;
              if (SVar3 <= uVar6) {
                SVar8 = uVar6 * 2;
                if (SVar8 == 0) {
                  SVar8 = 4;
                }
                pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
                (this->_longstr)._vals = pcVar5;
                (this->_longstr)._allocated = SVar8;
              }
              goto LAB_00116d01;
            }
            if (bVar1 != 0x61) goto switchD_00116eca_caseD_6f;
            uVar6 = (this->_longstr)._size;
            SVar3 = (this->_longstr)._allocated;
            if (SVar3 <= uVar6) {
              SVar8 = uVar6 * 2;
              if (SVar8 == 0) {
                SVar8 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = SVar8;
            }
            SVar3 = (this->_longstr)._size;
            (this->_longstr)._size = SVar3 + 1;
            (this->_longstr)._vals[SVar3] = '\a';
          }
          goto LAB_00116fea;
        }
        switch(bVar1) {
        case 0x6e:
          uVar6 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar6) {
            SVar8 = uVar6 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = SVar8;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = '\n';
          break;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x73:
        case 0x77:
switchD_00116eca_caseD_6f:
          (*this->_errfunc)(this->_errtarget,"unrecognised escaper char");
          goto LAB_00116c50;
        case 0x72:
          uVar6 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar6) {
            SVar8 = uVar6 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = SVar8;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = '\r';
          break;
        case 0x74:
          uVar6 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar6) {
            SVar8 = uVar6 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = SVar8;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = '\t';
          break;
        case 0x75:
switchD_00116eca_caseD_75:
          ProcessStringHexEscape(this,local_50,(ulong)(bVar1 != 0x75) * 4 + 4);
          uVar6 = strtoul(local_50,&local_38,0x10);
          AddUTF8(this,uVar6);
          goto LAB_00116c50;
        case 0x76:
          uVar6 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar6) {
            SVar8 = uVar6 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = SVar8;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = '\v';
          break;
        case 0x78:
          ProcessStringHexEscape(this,(SQChar *)&local_38,2);
          uVar7 = strtoul((char *)&local_38,(char **)local_50,0x10);
          uVar6 = (this->_longstr)._size;
          SVar3 = (this->_longstr)._allocated;
          if (SVar3 <= uVar6) {
            SVar8 = uVar6 * 2;
            if (SVar8 == 0) {
              SVar8 = 4;
            }
            pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
            (this->_longstr)._vals = pcVar5;
            (this->_longstr)._allocated = SVar8;
          }
          SVar3 = (this->_longstr)._size;
          (this->_longstr)._size = SVar3 + 1;
          (this->_longstr)._vals[SVar3] = (char)uVar7;
          goto LAB_00116c50;
        default:
          if (bVar1 == 0x62) {
            uVar6 = (this->_longstr)._size;
            SVar3 = (this->_longstr)._allocated;
            if (SVar3 <= uVar6) {
              SVar8 = uVar6 * 2;
              if (SVar8 == 0) {
                SVar8 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = SVar8;
            }
            SVar3 = (this->_longstr)._size;
            (this->_longstr)._size = SVar3 + 1;
            (this->_longstr)._vals[SVar3] = '\b';
          }
          else {
            if (bVar1 != 0x66) goto switchD_00116eca_caseD_6f;
            uVar6 = (this->_longstr)._size;
            SVar3 = (this->_longstr)._allocated;
            if (SVar3 <= uVar6) {
              SVar8 = uVar6 * 2;
              if (SVar8 == 0) {
                SVar8 = 4;
              }
              pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
              (this->_longstr)._vals = pcVar5;
              (this->_longstr)._allocated = SVar8;
            }
            SVar3 = (this->_longstr)._size;
            (this->_longstr)._size = SVar3 + 1;
            (this->_longstr)._vals[SVar3] = '\f';
          }
        }
      }
    }
    else {
      if (bVar1 == 0) {
        (*this->_errfunc)(this->_errtarget,"unfinished string");
        return -1;
      }
      uVar6 = (this->_longstr)._size;
      SVar3 = (this->_longstr)._allocated;
      if (SVar3 <= uVar6) {
        SVar8 = uVar6 * 2;
        if (SVar8 == 0) {
          SVar8 = 4;
        }
        pcVar5 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
        (this->_longstr)._vals = pcVar5;
        (this->_longstr)._allocated = SVar8;
      }
      SVar3 = (this->_longstr)._size;
      (this->_longstr)._size = SVar3 + 1;
      (this->_longstr)._vals[SVar3] = bVar1;
    }
  }
LAB_00116fea:
  SVar4 = (*this->_readf)(this->_up);
  if (0xff < SVar4) {
    (*this->_errfunc)(this->_errtarget,"Invalid character");
  }
  if (SVar4 == 0) {
    this->_currdata = '\0';
    this->_reached_eof = 1;
  }
  else {
    this->_currdata = (LexChar)SVar4;
  }
  this->_currentcolumn = this->_currentcolumn + 1;
  goto LAB_00116c50;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim)
{
    INIT_TEMP_STRING();
    NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                Error(_SC("unfinished string"));
                return -1;
            case _SC('\n'):
                if(!verbatim) Error(_SC("newline in a constant"));
                APPEND_CHAR(CUR_CHAR); NEXT();
                _currentline++;
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
#ifdef SQUNICODE
#if WCHAR_SIZE == 2
                        AddUTF16(scstrtoul(temp, &stemp, 16));
#else
                        APPEND_CHAR((SQChar)scstrtoul(temp, &stemp, 16));
#endif
#else
                        AddUTF8(scstrtoul(temp, &stemp, 16));
#endif
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    default:
                        Error(_SC("unrecognised escaper char"));
                    break;
                    }
                }
                break;
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();
        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        if(len == 0) Error(_SC("empty constant"));
        if(len > 1) Error(_SC("constant too long"));
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    _svalue = &_longstr[0];
    return TK_STRING_LITERAL;
}